

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O2

void ucnv_toUnicode_UTF8(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  UConverterSharedData *pUVar5;
  UBool UVar6;
  uint uVar7;
  uint length;
  byte *pbVar8;
  UChar UVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  UChar *pUVar13;
  byte *pbVar14;
  long lVar15;
  
  pUVar2 = args->converter;
  pbVar14 = (byte *)args->source;
  pUVar13 = args->target;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  pUVar5 = pUVar2->sharedData;
  uVar11 = (uint)pUVar2->toULength;
  pbVar8 = pbVar14;
  if (pUVar4 <= pUVar13 || (int)uVar11 < 1) goto LAB_0016ae96;
  uVar10 = pUVar2->toUnicodeStatus;
  length = pUVar2->mode;
  pUVar2->toULength = '\0';
  pUVar2->toUnicodeStatus = 0;
  do {
    uVar12 = (ulong)uVar11;
    uVar7 = uVar11;
    if ((int)uVar11 <= (int)length) {
      uVar7 = length;
    }
    lVar15 = 0;
    while( true ) {
      pbVar8 = pbVar14 + lVar15;
      if ((long)(int)length <= (long)(uVar12 + lVar15)) break;
      if (pbVar3 <= pbVar8) {
        pUVar2->toUnicodeStatus = uVar10;
        pUVar2->mode = length;
        pUVar2->toULength = (char)uVar11 + (char)lVar15;
        goto LAB_0016afcc;
      }
      bVar1 = *pbVar8;
      pUVar2->toUBytes[lVar15 + uVar12] = bVar1;
      UVar6 = icu_63::UTF8::isValidTrail(uVar10,bVar1,(int32_t)(uVar12 + lVar15),length);
      if ((UVar6 == '\0') &&
         ((((pUVar5 != &_CESU8Data_63 || (uVar12 + lVar15 != 1)) || (uVar10 != 0xed)) ||
          (-0x41 < (char)bVar1)))) {
        uVar7 = uVar11 + (int)lVar15;
        break;
      }
      uVar10 = uVar10 * 0x40 + (uint)bVar1;
      lVar15 = lVar15 + 1;
    }
    if ((uVar7 != length) || (pUVar5 == &_CESU8Data_63 && 3 < uVar7)) {
      pUVar2->toULength = (int8_t)uVar7;
      *err = U_ILLEGAL_CHAR_FOUND;
LAB_0016afcc:
      if ((pbVar8 < pbVar3) && ((pUVar4 <= pUVar13 && (*err < U_ILLEGAL_ARGUMENT_ERROR)))) {
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      args->target = pUVar13;
      args->source = (char *)pbVar8;
      return;
    }
    uVar10 = uVar10 - offsetsFromUTF8[(int)length];
    if (uVar10 < 0x10000) {
      *pUVar13 = (UChar)uVar10;
      pUVar13 = pUVar13 + 1;
    }
    else {
      *pUVar13 = (short)(uVar10 >> 10) + L'ퟀ';
      UVar9 = (UChar)uVar10 & 0x3ffU | 0xdc00;
      if (pUVar4 <= pUVar13 + 1) {
        pUVar2->UCharErrorBuffer[0] = UVar9;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        pUVar13 = pUVar13 + 1;
        goto LAB_0016afcc;
      }
      pUVar13[1] = UVar9;
      pUVar13 = pUVar13 + 2;
    }
LAB_0016ae96:
    while( true ) {
      if ((pbVar3 <= pbVar8) || (pUVar4 <= pUVar13)) goto LAB_0016afcc;
      bVar1 = *pbVar8;
      if ((char)bVar1 < '\0') break;
      *pUVar13 = (short)(char)bVar1;
      pUVar13 = pUVar13 + 1;
      pbVar8 = pbVar8 + 1;
    }
    uVar10 = (uint)bVar1;
    pUVar2->toUBytes[0] = bVar1;
    pbVar14 = pbVar8 + 1;
    length = 0;
    uVar11 = 1;
    if ((byte)(bVar1 + 0x3e) < 0x33) {
      length = ((uint)(0xdf < bVar1) - (uint)(bVar1 < 0xf0)) + 3;
    }
  } while( true );
}

Assistant:

U_CDECL_BEGIN
static void  U_CALLCONV ucnv_toUnicode_UTF8 (UConverterToUnicodeArgs * args,
                                  UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = cnv->toUBytes;
    UBool isCESU8 = hasCESU8Data(cnv);
    uint32_t ch, ch2 = 0;
    int32_t i, inBytes;

    /* Restore size of current sequence */
    if (cnv->toULength > 0 && myTarget < targetLimit)
    {
        inBytes = cnv->mode;            /* restore # of bytes to consume */
        i = cnv->toULength;             /* restore # of bytes consumed */
        cnv->toULength = 0;

        ch = cnv->toUnicodeStatus;/*Stores the previously calculated ch from a previous call*/
        cnv->toUnicodeStatus = 0;
        goto morebytes;
    }


    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);
        if (U8_IS_SINGLE(ch))        /* Simple case */
        {
            *(myTarget++) = (UChar) ch;
        }
        else
        {
            /* store the first char */
            toUBytes[0] = (char)ch;
            inBytes = U8_COUNT_BYTES_NON_ASCII(ch); /* lookup current sequence length */
            i = 1;

morebytes:
            while (i < inBytes)
            {
                if (mySource < sourceLimit)
                {
                    toUBytes[i] = (char) (ch2 = *mySource);
                    if (!icu::UTF8::isValidTrail(ch, static_cast<uint8_t>(ch2), i, inBytes) &&
                            !(isCESU8 && i == 1 && ch == 0xed && U8_IS_TRAIL(ch2)))
                    {
                        break; /* i < inBytes */
                    }
                    ch = (ch << 6) + ch2;
                    ++mySource;
                    i++;
                }
                else
                {
                    /* stores a partially calculated target*/
                    cnv->toUnicodeStatus = ch;
                    cnv->mode = inBytes;
                    cnv->toULength = (int8_t) i;
                    goto donefornow;
                }
            }

            // In CESU-8, only surrogates, not supplementary code points, are encoded directly.
            if (i == inBytes && (!isCESU8 || i <= 3))
            {
                /* Remove the accumulated high bits */
                ch -= offsetsFromUTF8[inBytes];

                /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
                if (ch <= MAXIMUM_UCS2) 
                {
                    /* fits in 16 bits */
                    *(myTarget++) = (UChar) ch;
                }
                else
                {
                    /* write out the surrogates */
                    *(myTarget++) = U16_LEAD(ch);
                    ch = U16_TRAIL(ch);
                    if (myTarget < targetLimit)
                    {
                        *(myTarget++) = (UChar)ch;
                    }
                    else
                    {
                        /* Put in overflow buffer (not handled here) */
                        cnv->UCharErrorBuffer[0] = (UChar) ch;
                        cnv->UCharErrorBufferLength = 1;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                        break;
                    }
                }
            }
            else
            {
                cnv->toULength = (int8_t)i;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
}